

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# m3x3.cpp
# Opt level: O1

void M3x3_ExtractEulerAngles_XYZ(double (*matrix) [3],double *angles)

{
  double dVar1;
  double dVar2;
  double dVar3;
  
  dVar3 = (*matrix)[0];
  if ((dVar3 != 9999999.0) || (NAN(dVar3))) {
    dVar3 = dVar3 * dVar3 + (*matrix)[1] * (*matrix)[1];
    if (dVar3 < 0.0) {
      dVar3 = sqrt(dVar3);
    }
    else {
      dVar3 = SQRT(dVar3);
    }
    dVar1 = atan2((*matrix)[2],dVar3);
    if (0.0001 <= dVar3) {
      dVar3 = atan2(-(*matrix)[1],(*matrix)[0]);
      dVar2 = atan2(-matrix[1][2],matrix[2][2]);
      dVar3 = dVar3 * 57.29577951308232;
    }
    else {
      dVar3 = matrix[1][0];
      if (dVar1 <= 0.0) {
        dVar3 = -dVar3;
      }
      dVar2 = atan2(dVar3,matrix[1][1]);
      dVar3 = 0.0;
    }
    *angles = dVar2 * 57.29577951308232;
    dVar1 = dVar1 * 57.29577951308232;
  }
  else {
    *angles = 9999999.0;
    dVar1 = 9999999.0;
    dVar3 = 9999999.0;
  }
  angles[1] = dVar1;
  angles[2] = dVar3;
  return;
}

Assistant:

void M3x3_ExtractEulerAngles_XYZ(
  double matrix[3][3],
  double angles[3])
{
    double ax,ay,az;
    double cosY;

/*
   R[XYZ] = Rx * Ry * Rz

            | 1   0    0 |   |  cy   0   sy |   | cz   -sz   0 |
          = | 0   cx  -sx| * |   0   1    0 | * | sz    cz   0 |
            | 0   sx   cx|   | -sy   0   cy |   |  0    0    1 |


            | cycz            -cysz             sy   |
          = | cxsz + sxsycz    cxcz - sxsysz   -sxcy |
            | sxsz - cxsycz    sxcz + cxsysz    cxcy |
*/

    if (matrix[0][0] == XEMPTY)
    {
        angles[0] = XEMPTY;
        angles[1] = XEMPTY;
        angles[2] = XEMPTY;
        return;
    }

    cosY = sqrt(matrix[0][0]*matrix[0][0] + matrix[0][1]*matrix[0][1]);
    ay = atan2(matrix[0][2], cosY);

    if (cosY < 0.0001) // cos(ay) < 0.01
    {
     // Assume sy=+-1,cy=0,sz=0,cz=1.0 and decode the matrix accordingly

        if (ay > 0)
            ax = atan2( matrix[1][0], matrix[1][1]);
        else
            ax = atan2(-matrix[1][0], matrix[1][1]);

        az = 0.0;
    }
    else
    {
        az = atan2(-matrix[0][1], matrix[0][0]);
        ax = atan2(-matrix[1][2], matrix[2][2]);
    }

    angles[0] = ax * (180.0/M_PI);
    angles[1] = ay * (180.0/M_PI);
    angles[2] = az * (180.0/M_PI);
}